

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.hpp
# Opt level: O2

void __thiscall
soplex::
Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::validateSolveReal(Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *soplex)

{
  string *__lhs;
  double a;
  Real RVar1;
  bool bVar2;
  type_conflict5 tVar3;
  bool bVar4;
  ostream *poVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  uint *puVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  shared_ptr<soplex::Tolerances> *psVar14;
  byte bVar15;
  string reason;
  undefined1 local_c38 [112];
  int local_bc8;
  bool local_bc4;
  fpclass_type local_bc0;
  int32_t iStack_bbc;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sol;
  cpp_dec_float<200U,_int,_void> local_b38;
  cpp_dec_float<200U,_int,_void> local_ab8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxBoundViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_730;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  cpp_dec_float<200U,_int,_void> local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumBoundViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar15 = 0;
  std::__cxx11::string::string((string *)&reason,"",(allocator *)&local_ab8);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_ab8,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&maxBoundViolation.m_backend,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&maxRowViolation.m_backend,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&maxRedCostViolation.m_backend,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&maxDualViolation.m_backend,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&sumBoundViolation.m_backend,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&sumRowViolation.m_backend,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&sumRedCostViolation.m_backend,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&sumDualViolation.m_backend,0.0,(type *)0x0);
  sol.m_backend.fpclass = cpp_dec_float_finite;
  sol.m_backend.prec_elem = 0x1c;
  sol.m_backend.data._M_elems[0] = 0;
  sol.m_backend.data._M_elems[1] = 0;
  sol.m_backend.data._M_elems[2] = 0;
  sol.m_backend.data._M_elems[3] = 0;
  sol.m_backend.data._M_elems[4] = 0;
  sol.m_backend.data._M_elems[5] = 0;
  sol.m_backend.data._M_elems[6] = 0;
  sol.m_backend.data._M_elems[7] = 0;
  sol.m_backend.data._M_elems[8] = 0;
  sol.m_backend.data._M_elems[9] = 0;
  sol.m_backend.data._M_elems[10] = 0;
  sol.m_backend.data._M_elems[0xb] = 0;
  sol.m_backend.data._M_elems[0xc] = 0;
  sol.m_backend.data._M_elems[0xd] = 0;
  sol.m_backend.data._M_elems[0xe] = 0;
  sol.m_backend.data._M_elems[0xf] = 0;
  sol.m_backend.data._M_elems[0x10] = 0;
  sol.m_backend.data._M_elems[0x11] = 0;
  sol.m_backend.data._M_elems[0x12] = 0;
  sol.m_backend.data._M_elems[0x13] = 0;
  sol.m_backend.data._M_elems[0x18] = 0;
  sol.m_backend.data._M_elems[0x19] = 0;
  sol.m_backend.data._M_elems._104_5_ = 0;
  sol.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  sol.m_backend.exp = 0;
  sol.m_backend.neg = false;
  sol.m_backend.data._M_elems[0x14] = 0;
  sol.m_backend.data._M_elems[0x15] = 0;
  sol.m_backend.data._M_elems[0x16] = 0;
  sol.m_backend.data._M_elems[0x17] = 0;
  poVar6 = (soplex->spxout).m_streams[3];
  __lhs = &this->validatesolution;
  bVar2 = std::operator==(__lhs,"+infinity");
  if (bVar2) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&sol,soplex->_currentSettings->_realParamValues[6]);
  }
  else {
    bVar2 = std::operator==(__lhs,"-infinity");
    if (bVar2) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&sol,-soplex->_currentSettings->_realParamValues[6]
                );
    }
    else {
      a = atof((__lhs->_M_dataplus)._M_p);
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&sol,a);
    }
  }
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::objValueReal((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_b38,soplex);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result.m_backend,&sol.m_backend,&local_b38);
  boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((type *)local_c38,(multiprecision *)&result,arg);
  puVar9 = (uint *)local_c38;
  pcVar10 = &local_ab8;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pcVar10->data)._M_elems[0] = *puVar9;
    puVar9 = puVar9 + (ulong)bVar15 * -2 + 1;
    pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + ((ulong)bVar15 * -2 + 1) * 4);
  }
  local_ab8.exp = local_bc8;
  local_ab8.neg = local_bc4;
  local_ab8.fpclass = local_bc0;
  local_ab8.prec_elem = iStack_bbc;
  if (soplex->_status == INForUNBD) {
    local_c38._0_8_ = soplex->_currentSettings->_realParamValues[6];
    tVar3 = boost::multiprecision::operator==(&sol,(double *)local_c38);
    if (!tVar3) {
      local_b38.data._M_elems._0_8_ = -soplex->_currentSettings->_realParamValues[6];
      tVar3 = boost::multiprecision::operator==(&sol,(double *)&local_b38);
      if (!tVar3) goto LAB_003a5a5e;
    }
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_ab8,0.0);
  }
LAB_003a5a5e:
  pcVar10 = &local_ab8;
  pnVar12 = &local_330;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pnVar12->m_backend).data._M_elems[0] = (pcVar10->data)._M_elems[0];
    pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + ((ulong)bVar15 * -2 + 1) * 4);
    pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar12 + ((ulong)bVar15 * -2 + 1) * 4);
  }
  local_330.m_backend.exp = local_ab8.exp;
  local_330.m_backend.neg = local_ab8.neg;
  local_330.m_backend.fpclass = local_ab8.fpclass;
  local_330.m_backend.prec_elem = local_ab8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_3b0,0.0,(type *)0x0);
  pnVar12 = &this->validatetolerance;
  pnVar11 = pnVar12;
  pnVar13 = &local_b0;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + (ulong)bVar15 * -8 + 4);
    pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
  }
  local_b0.m_backend.exp = (this->validatetolerance).m_backend.exp;
  local_b0.m_backend.neg = (this->validatetolerance).m_backend.neg;
  local_b0.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
  local_b0.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
  bVar2 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_330,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_3b0,&local_b0);
  if (!bVar2) {
    std::__cxx11::string::append((char *)&reason);
  }
  if (soplex->_status == OPTIMAL) {
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getBoundViolation(soplex,&maxBoundViolation,&sumBoundViolation);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRowViolation(soplex,&maxRowViolation,&sumRowViolation);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRedCostViolation(soplex,&maxRedCostViolation,&sumRedCostViolation);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getDualViolation(soplex,&maxDualViolation,&sumDualViolation);
    lVar7 = 0x1c;
    pnVar11 = &maxBoundViolation;
    pnVar13 = &local_430;
    for (lVar8 = lVar7; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
    }
    local_430.m_backend.exp = maxBoundViolation.m_backend.exp;
    local_430.m_backend.neg = maxBoundViolation.m_backend.neg;
    local_430.m_backend.fpclass = maxBoundViolation.m_backend.fpclass;
    local_430.m_backend.prec_elem = maxBoundViolation.m_backend.prec_elem;
    pnVar11 = pnVar12;
    pnVar13 = &local_4b0;
    for (; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + (ulong)bVar15 * -8 + 4);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
    }
    local_4b0.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_4b0.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_4b0.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_4b0.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    psVar14 = &soplex->_tolerances;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_c38,
               &psVar14->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar1 = Tolerances::epsilon((Tolerances *)local_c38._0_8_);
    bVar4 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_430,&local_4b0,RVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c38 + 8));
    if (!bVar4) {
      std::__cxx11::string::append((char *)&reason);
      bVar2 = false;
    }
    lVar7 = 0x1c;
    pnVar11 = &maxRowViolation;
    pnVar13 = &local_530;
    for (lVar8 = lVar7; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
    }
    local_530.m_backend.exp = maxRowViolation.m_backend.exp;
    local_530.m_backend.neg = maxRowViolation.m_backend.neg;
    local_530.m_backend.fpclass = maxRowViolation.m_backend.fpclass;
    local_530.m_backend.prec_elem = maxRowViolation.m_backend.prec_elem;
    pnVar11 = pnVar12;
    pnVar13 = &local_5b0;
    for (; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + (ulong)bVar15 * -8 + 4);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
    }
    local_5b0.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_5b0.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_5b0.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_5b0.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_c38,
               &psVar14->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar1 = Tolerances::epsilon((Tolerances *)local_c38._0_8_);
    bVar4 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_530,&local_5b0,RVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c38 + 8));
    if (!bVar4) {
      std::__cxx11::string::append((char *)&reason);
      bVar2 = false;
    }
    lVar7 = 0x1c;
    pnVar11 = &maxRedCostViolation;
    pnVar13 = &local_630;
    for (lVar8 = lVar7; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
    }
    local_630.m_backend.exp = maxRedCostViolation.m_backend.exp;
    local_630.m_backend.neg = maxRedCostViolation.m_backend.neg;
    local_630.m_backend.fpclass = maxRedCostViolation.m_backend.fpclass;
    local_630.m_backend.prec_elem = maxRedCostViolation.m_backend.prec_elem;
    pnVar11 = pnVar12;
    pnVar13 = &local_6b0;
    for (; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + (ulong)bVar15 * -8 + 4);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
    }
    local_6b0.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_6b0.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_6b0.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_6b0.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_c38,
               &psVar14->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar1 = Tolerances::epsilon((Tolerances *)local_c38._0_8_);
    bVar4 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_630,&local_6b0,RVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c38 + 8));
    if (!bVar4) {
      std::__cxx11::string::append((char *)&reason);
      bVar2 = false;
    }
    lVar7 = 0x1c;
    pnVar11 = &maxDualViolation;
    pnVar13 = &local_730;
    for (lVar8 = lVar7; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
    }
    local_730.m_backend.exp = maxDualViolation.m_backend.exp;
    local_730.m_backend.neg = maxDualViolation.m_backend.neg;
    local_730.m_backend.fpclass = maxDualViolation.m_backend.fpclass;
    local_730.m_backend.prec_elem = maxDualViolation.m_backend.prec_elem;
    pnVar11 = &local_7b0;
    for (; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + (ulong)bVar15 * -8 + 4);
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
    }
    local_7b0.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_7b0.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_7b0.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_7b0.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_c38,
               &psVar14->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar1 = Tolerances::epsilon((Tolerances *)local_c38._0_8_);
    bVar4 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_730,&local_7b0,RVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c38 + 8));
    if (!bVar4) {
      std::__cxx11::string::append((char *)&reason);
      bVar2 = false;
    }
  }
  std::operator<<(poVar6,"\n");
  std::operator<<(poVar6,"Validation          :");
  if (bVar2 == false) {
    reason._M_dataplus._M_p[reason._M_string_length - 2] = ']';
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b38,
                   " Fail [",&reason);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b38,
                   "\n");
    std::operator<<(poVar6,(string *)local_c38);
    std::__cxx11::string::~string((string *)local_c38);
    std::__cxx11::string::~string((string *)&local_b38);
  }
  else {
    std::operator<<(poVar6," Success\n");
  }
  poVar5 = std::operator<<(poVar6,"   Objective        : ");
  lVar7 = *(long *)poVar5;
  lVar8 = *(long *)(lVar7 + -0x18);
  *(uint *)(poVar5 + lVar8 + 0x18) = *(uint *)(poVar5 + lVar8 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar5 + *(long *)(lVar7 + -0x18) + 8) = 8;
  poVar5 = boost::multiprecision::operator<<
                     (poVar5,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_ab8);
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar6,"   Bound            : ");
  lVar7 = *(long *)poVar5;
  lVar8 = *(long *)(lVar7 + -0x18);
  *(uint *)(poVar5 + lVar8 + 0x18) = *(uint *)(poVar5 + lVar8 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar5 + *(long *)(lVar7 + -0x18) + 8) = 8;
  poVar5 = boost::multiprecision::operator<<(poVar5,&maxBoundViolation);
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar6,"   Row              : ");
  lVar7 = *(long *)poVar5;
  lVar8 = *(long *)(lVar7 + -0x18);
  *(uint *)(poVar5 + lVar8 + 0x18) = *(uint *)(poVar5 + lVar8 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar5 + *(long *)(lVar7 + -0x18) + 8) = 8;
  poVar5 = boost::multiprecision::operator<<(poVar5,&maxRowViolation);
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar6,"   Reduced Cost     : ");
  lVar7 = *(long *)poVar5;
  lVar8 = *(long *)(lVar7 + -0x18);
  *(uint *)(poVar5 + lVar8 + 0x18) = *(uint *)(poVar5 + lVar8 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar5 + *(long *)(lVar7 + -0x18) + 8) = 8;
  poVar5 = boost::multiprecision::operator<<(poVar5,&maxRedCostViolation);
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(poVar5,"\n");
  poVar6 = std::operator<<(poVar6,"   Dual             : ");
  lVar7 = *(long *)poVar6;
  lVar8 = *(long *)(lVar7 + -0x18);
  *(uint *)(poVar6 + lVar8 + 0x18) = *(uint *)(poVar6 + lVar8 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 8) = 8;
  poVar6 = boost::multiprecision::operator<<(poVar6,&maxDualViolation);
  *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string((string *)&reason);
  return;
}

Assistant:

void Validation<R>::validateSolveReal(SoPlexBase<R>& soplex)
{
   bool passedValidation = true;
   std::string reason = "";
   R objViolation = 0.0;
   R maxBoundViolation = 0.0;
   R maxRowViolation = 0.0;
   R maxRedCostViolation = 0.0;
   R maxDualViolation = 0.0;
   R sumBoundViolation = 0.0;
   R sumRowViolation = 0.0;
   R sumRedCostViolation = 0.0;
   R sumDualViolation = 0.0;
   R sol;

   std::ostream& os = soplex.spxout.getStream(SPxOut::INFO1);

   if(validatesolution == "+infinity")
   {
      sol = soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else if(validatesolution == "-infinity")
   {
      sol = -soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else
   {
      sol = atof(validatesolution.c_str());
   }

   objViolation = spxAbs(sol - soplex.objValueReal());

   // skip check in case presolving detected infeasibility/unboundedness
   if(SPxSolverBase<R>::INForUNBD == soplex.status() &&
         (sol == soplex.realParam(SoPlexBase<R>::INFTY)
          || sol == -soplex.realParam(SoPlexBase<R>::INFTY)))
      objViolation = 0.0;

   if(! EQ(objViolation, R(0.0), validatetolerance))
   {
      passedValidation = false;
      reason += "Objective Violation; ";
   }

   if(SPxSolverBase<R>::OPTIMAL == soplex.status())
   {
      soplex.getBoundViolation(maxBoundViolation, sumBoundViolation);
      soplex.getRowViolation(maxRowViolation, sumRowViolation);
      soplex.getRedCostViolation(maxRedCostViolation, sumRedCostViolation);
      soplex.getDualViolation(maxDualViolation, sumDualViolation);

      if(! LE(maxBoundViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Bound Violation; ";
      }

      if(! LE(maxRowViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Row Violation; ";
      }

      if(! LE(maxRedCostViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Reduced Cost Violation; ";
      }

      if(! LE(maxDualViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Dual Violation; ";
      }
   }

   os << "\n";
   os << "Validation          :";

   if(passedValidation)
      os << " Success\n";
   else
   {
      reason[reason.length() - 2] = ']';
      os << " Fail [" + reason + "\n";
   }

   os << "   Objective        : " << std::scientific << std::setprecision(
         8) << objViolation << std::fixed << "\n";
   os << "   Bound            : " << std::scientific << std::setprecision(
         8) << maxBoundViolation << std::fixed << "\n";
   os << "   Row              : " << std::scientific << std::setprecision(
         8) << maxRowViolation << std::fixed << "\n";
   os << "   Reduced Cost     : " << std::scientific << std::setprecision(
         8) << maxRedCostViolation << std::fixed << "\n";
   os << "   Dual             : " << std::scientific << std::setprecision(
         8) << maxDualViolation << std::fixed << "\n";
}